

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QKbo.cpp
# Opt level: O0

Result __thiscall Kernel::QKbo::compare(QKbo *this,Literal *l1,Literal *l2)

{
  anon_class_24_3_028f1164 ord1;
  anon_class_16_2_f9f0633a ords;
  anon_class_24_3_02943ac4 ord2;
  anon_class_24_3_676d14a6 ord1_00;
  anon_class_24_3_02943ac4 ord2_00;
  undefined1 uVar1;
  undefined1 uVar2;
  tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>
  *ptVar3;
  long in_RDX;
  long in_RSI;
  QKbo *in_RDI;
  tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>
  *a2;
  tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>
  *a1;
  Option<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
  a2_;
  Option<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
  a1_;
  bool i2;
  bool i1;
  Literal *in_stack_fffffffffffffec0;
  undefined6 in_stack_fffffffffffffef8;
  Literal **in_stack_ffffffffffffff08;
  Literal *in_stack_ffffffffffffff10;
  QKbo *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  Literal **in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
  local_a8;
  OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
  local_88;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 local_22;
  byte local_21;
  undefined1 local_20 [8];
  undefined1 local_18 [20];
  Result local_4;
  
  if (in_RSI == in_RDX) {
    local_4 = EQUAL;
  }
  else {
    local_21 = AlascaState::interpretedPred(in_stack_fffffffffffffec0);
    local_22 = AlascaState::interpretedPred(in_stack_fffffffffffffec0);
    if (((local_21 & 1) == 0) || ((bool)local_22)) {
      if (((local_21 & 1) == 0) && ((bool)local_22)) {
        local_4 = GREATER;
      }
      else if (((local_21 & 1) != 0) || ((bool)local_22)) {
        atomsWithLvl(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        atomsWithLvl(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        uVar1 = Lib::
                OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                ::isSome(&local_88);
        if (((bool)uVar1) &&
           (uVar2 = Lib::
                    OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                    ::isSome(&local_a8), (bool)uVar2)) {
          ptVar3 = Lib::
                   OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                   ::unwrap((OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                             *)0x92e8ae);
          Lib::
          OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
          ::unwrap((OptionBase<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                    *)0x92e8cf);
          ord1.a2._0_6_ = in_stack_fffffffffffffef8;
          ord1.a1 = ptVar3;
          ord1.a2._6_1_ = uVar2;
          ord1.a2._7_1_ = uVar1;
          ord1.this = in_RDI;
          ord2.l2 = (Literal **)local_20;
          ord2.l1 = (Literal **)local_18;
          ord2.this = in_RDI;
          local_4 = OrderingUtils::
                    lexProductCapture<Kernel::QKbo::compare(Kernel::Literal*,Kernel::Literal*)const::__4,Kernel::QKbo::compare(Kernel::Literal*,Kernel::Literal*)const::__0>
                              (ord1,ord2);
        }
        else {
          local_4 = INCOMPARABLE;
        }
        Lib::
        Option<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
        ::~Option((Option<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                   *)0x92e983);
        Lib::
        Option<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
        ::~Option((Option<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
                   *)0x92e990);
      }
      else {
        local_38 = local_18;
        local_30 = local_20;
        local_58 = local_18;
        local_50 = local_20;
        local_68 = local_18;
        local_60 = local_20;
        ord1_00.l1 = (Literal **)in_stack_ffffffffffffff28;
        ord1_00.this = (QKbo *)in_stack_ffffffffffffff20;
        ord1_00.l2 = in_stack_ffffffffffffff30;
        ord2_00.l2 = (Literal **)in_stack_ffffffffffffff40;
        ord2_00.l1 = (Literal **)in_stack_ffffffffffffff38;
        ord2_00.this._0_4_ = in_stack_ffffffffffffff48;
        ord2_00.this._4_4_ = in_stack_ffffffffffffff4c;
        ords.l2 = in_stack_ffffffffffffff08;
        ords.l1 = (Literal **)in_RDI;
        local_4 = OrderingUtils::
                  lexProductCapture<Kernel::QKbo::compare(Kernel::Literal*,Kernel::Literal*)const::__1,Kernel::QKbo::compare(Kernel::Literal*,Kernel::Literal*)const::__2,Kernel::QKbo::compare(Kernel::Literal*,Kernel::Literal*)const::__3>
                            (ord1_00,ord2_00,ords);
      }
    }
    else {
      local_4 = LESS;
    }
  }
  return local_4;
}

Assistant:

QKbo::Result QKbo::compare(Literal* l1, Literal* l2) const 
{
  if (l1 == l2) 
    return Result::EQUAL;

  auto i1 = AlascaState::interpretedPred(l1);
  auto i2 = AlascaState::interpretedPred(l2);
       if ( i1 && !i2) return Result::LESS;
  else if (!i1 &&  i2) return Result::GREATER;
  else if (!i1 && !i2) return TIME_TRACE_EXPR("uninterpreted", OU::lexProductCapture(
        [&]() { return _kbo.comparePredicatePrecedences(l1->functor(), l2->functor()); }
      , [&]() { return OU::lexExt(termArgIter(l1), termArgIter(l2), this->asClosure()); }
      , [&]() { return OU::stdCompare(l1->isNegative(), l2->isNegative()); }
    ));
  else {
    ASS(i1 && i2)
   
    auto a1_ = atomsWithLvl(l1);
    auto a2_ = atomsWithLvl(l2);
    if (!a1_.isSome() || !a2_.isSome())
      return Result::INCOMPARABLE;
    auto& a1 = a1_.unwrap();
    auto& a2 = a2_.unwrap();
    return OU::lexProductCapture(
        [&]() -> Ordering::Result { 
        TIME_TRACE("atoms with levels")
        return OU::weightedMulExt(*std::get<0>(a1), *std::get<0>(a2), 
                          [&](auto const& l, auto const& r)
                          { return OU::lexProductCapture(
                              [&]() { return this->compare(l.term, r.term); }
                            , [&]() { return OU::stdCompare(std::get<1>(a1),std::get<1>(a2)); }
                          );}); }
      , [&]() {
        // the atoms of the two literals are the same. 
        // This means they must be of the same sort
        auto sort =  SortHelper::getTermArgSort(l1,0);
        ASS_EQ(sort, SortHelper::getTermArgSort(l2,0));
        ASS_EQ(l1->isEquality() && l1->isPositive(), l2->isEquality() && l2->isPositive())
        return tryNumTraits([&](auto numTraits) {
          using NumTraits = decltype(numTraits);
          if (NumTraits::sort() != sort) {
            return Option<Ordering::Result>();
          } else {
            if (l1->isEquality() && l2->isEquality()) {
              TIME_TRACE("compare equalities")
              ASS_EQ(l1->isPositive(), l2->isPositive())
              return Option<Ordering::Result>(OU::lexProductCapture(
                  // TODO make use of the constant size of the multiset
                  [&]() { 
                    auto e1 = nfEquality<NumTraits>(l1);
                    auto e2 = nfEquality<NumTraits>(l2);
                    return OU::mulExt(*e1, *e2, this->asClosure()); }
                , [&]() { 
                  Recycled<MultiSet<TermList>> m1; m1->init(l1->termArg(0), l1->termArg(1));
                  Recycled<MultiSet<TermList>> m2; m2->init(l2->termArg(0), l2->termArg(1));
                  // TODO make use of the constant size of the multiset
                  return OU::mulExt(*m1,*m2,this->asClosure()); }
              ));
            } else if ( l1->isEquality() && !l2->isEquality()) {
              ASS(l1->isNegative())
              return Option<Ordering::Result>(Result::LESS);
            } else if (!l1->isEquality() &&  l2->isEquality()) {
              ASS(l2->isNegative())
              return Option<Ordering::Result>(Result::GREATER);
            } else if (l1->functor() == NumTraits::isIntF()) {
              ASS_EQ(l2->functor(), NumTraits::isIntF())
              ASS_EQ(l2->isPositive(), l1->isPositive())
              return some(this->compare(l1->termArg(0), l2->termArg(0)));
            } else {
              TIME_TRACE("compare inequqlities")
              ASS(l1->functor() == numTraits.greaterF() || l1->functor() == numTraits.geqF())
              ASS(l2->functor() == numTraits.greaterF() || l2->functor() == numTraits.geqF())
              ASS(l1->isPositive())
              ASS(l2->isPositive())
              return Option<Ordering::Result>(OU::lexProductCapture(
                  [&]() { return this->compare(l1->termArg(0), l2->termArg(0)); }
                , [&]() { return _kbo.comparePredicatePrecedences(l1->functor(), l2->functor()); }
              ));
            } 
          } 
        }) || [&]() {
          ASS_EQ(l1->isPositive(), l2->isPositive())
          // uninterpreted sort
          return Result::EQUAL;
        };
      }
    );
  }
}